

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alignment.h
# Opt level: O1

void __thiscall llvm::Align::Align(Align *this,uint64_t Value)

{
  long lVar1;
  
  this->ShiftValue = '\0';
  if (Value == 0) {
    __assert_fail("Value > 0 && \"Value must not be 0\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Alignment.h"
                  ,0x4e,"llvm::Align::Align(uint64_t)");
  }
  if ((Value & Value - 1) == 0) {
    lVar1 = 0x3f;
    if (Value != 0) {
      for (; Value >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    this->ShiftValue = (uint8_t)lVar1;
    return;
  }
  __assert_fail("llvm::isPowerOf2_64(Value) && \"Alignment is not a power of 2\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Alignment.h"
                ,0x4f,"llvm::Align::Align(uint64_t)");
}

Assistant:

explicit Align(uint64_t Value) {
    assert(Value > 0 && "Value must not be 0");
    assert(llvm::isPowerOf2_64(Value) && "Alignment is not a power of 2");
    ShiftValue = Log2_64(Value);
    assert(ShiftValue < 64 && "Broken invariant");
  }